

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fShaderHelperInvocationTests.cpp
# Opt level: O0

IterateResult __thiscall
deqp::gles31::Functional::anon_unknown_1::HelperInvocationDerivateCase::iterate
          (HelperInvocationDerivateCase *this)

{
  int iVar1;
  bool bVar2;
  int iVar3;
  deUint32 dVar4;
  deUint32 dVar5;
  RenderContext *renderCtx_00;
  undefined4 extraout_var;
  TestLog *pTVar6;
  char *str;
  FboHelper *pFVar7;
  ShaderProgram *this_00;
  PixelBufferAccess local_1c0;
  undefined1 local_198 [8];
  Surface result;
  Random rnd;
  allocator<char> local_149;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_148;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_128;
  ScopedLogSection local_108;
  ScopedLogSection section;
  int local_dc;
  string local_d8;
  allocator<char> local_a1;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_a0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_80;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_60;
  undefined1 local_40 [8];
  string sectionName;
  Functions *gl;
  RenderContext *renderCtx;
  HelperInvocationDerivateCase *this_local;
  
  renderCtx_00 = Context::getRenderContext((this->super_TestCase).m_context);
  iVar3 = (*renderCtx_00->_vptr_RenderContext[3])();
  sectionName.field_2._8_8_ = CONCAT44(extraout_var,iVar3);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_a0,"Iteration ",&local_a1);
  local_dc = this->m_iterNdx + 1;
  de::toString<int>(&local_d8,&local_dc);
  std::operator+(&local_80,&local_a0,&local_d8);
  std::operator+(&local_60,&local_80," / ");
  de::toString<int>((string *)&section,&this->m_numIters);
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_40,
                 &local_60,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&section);
  std::__cxx11::string::~string((string *)&section);
  std::__cxx11::string::~string((string *)&local_60);
  std::__cxx11::string::~string((string *)&local_80);
  std::__cxx11::string::~string((string *)&local_d8);
  std::__cxx11::string::~string((string *)&local_a0);
  std::allocator<char>::~allocator(&local_a1);
  pTVar6 = tcu::TestContext::getLog((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_148,"Iter",&local_149);
  de::toString<int>((string *)&rnd.m_rnd.z,&this->m_iterNdx);
  std::operator+(&local_128,&local_148,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&rnd.m_rnd.z);
  tcu::ScopedLogSection::ScopedLogSection(&local_108,pTVar6,&local_128,(string *)local_40);
  std::__cxx11::string::~string((string *)&local_128);
  std::__cxx11::string::~string((string *)&rnd.m_rnd.z);
  std::__cxx11::string::~string((string *)&local_148);
  std::allocator<char>::~allocator(&local_149);
  str = tcu::TestNode::getName((TestNode *)this);
  dVar4 = deStringHash(str);
  dVar5 = deInt32Hash(this->m_iterNdx);
  de::Random::Random((Random *)&result.m_pixels.m_cap,dVar4 ^ dVar5);
  tcu::Surface::Surface((Surface *)local_198,0x100,0x100);
  pFVar7 = de::details::
           UniqueBase<deqp::gles31::Functional::(anonymous_namespace)::FboHelper,_de::DefaultDeleter<deqp::gles31::Functional::(anonymous_namespace)::FboHelper>_>
           ::operator->(&(this->m_fbo).
                         super_UniqueBase<deqp::gles31::Functional::(anonymous_namespace)::FboHelper,_de::DefaultDeleter<deqp::gles31::Functional::(anonymous_namespace)::FboHelper>_>
                       );
  FboHelper::bindForRendering(pFVar7);
  (**(code **)(sectionName.field_2._8_8_ + 0x1c0))(0,0,0,0x3f800000);
  (**(code **)(sectionName.field_2._8_8_ + 0x188))(0x4000);
  this_00 = de::details::UniqueBase<glu::ShaderProgram,_de::DefaultDeleter<glu::ShaderProgram>_>::
            operator->(&(this->m_program).
                        super_UniqueBase<glu::ShaderProgram,_de::DefaultDeleter<glu::ShaderProgram>_>
                      );
  dVar4 = glu::ShaderProgram::getProgram(this_00);
  drawRandomPrimitives(renderCtx_00,dVar4,this->m_primitiveType,1,(Random *)&result.m_pixels.m_cap);
  pFVar7 = de::details::
           UniqueBase<deqp::gles31::Functional::(anonymous_namespace)::FboHelper,_de::DefaultDeleter<deqp::gles31::Functional::(anonymous_namespace)::FboHelper>_>
           ::operator->(&(this->m_fbo).
                         super_UniqueBase<deqp::gles31::Functional::(anonymous_namespace)::FboHelper,_de::DefaultDeleter<deqp::gles31::Functional::(anonymous_namespace)::FboHelper>_>
                       );
  tcu::Surface::getAccess(&local_1c0,(Surface *)local_198);
  FboHelper::readPixels(pFVar7,0,0,&local_1c0);
  pTVar6 = tcu::TestContext::getLog((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx);
  bVar2 = verifyHelperInvocationDerivate(pTVar6,(Surface *)local_198,this->m_numSamples != 0);
  if (!bVar2) {
    tcu::TestContext::setTestResult
              ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx,QP_TEST_RESULT_FAIL,
               "Invalid pixels found");
  }
  this->m_iterNdx = this->m_iterNdx + 1;
  iVar3 = this->m_iterNdx;
  iVar1 = this->m_numIters;
  tcu::Surface::~Surface((Surface *)local_198);
  de::Random::~Random((Random *)&result.m_pixels.m_cap);
  tcu::ScopedLogSection::~ScopedLogSection(&local_108);
  std::__cxx11::string::~string((string *)local_40);
  return (uint)(iVar3 < iVar1);
}

Assistant:

HelperInvocationDerivateCase::IterateResult HelperInvocationDerivateCase::iterate (void)
{
	const glu::RenderContext&		renderCtx	= m_context.getRenderContext();
	const glw::Functions&			gl			= renderCtx.getFunctions();
	const string					sectionName	= string("Iteration ") + de::toString(m_iterNdx+1) + " / " + de::toString(m_numIters);
	const tcu::ScopedLogSection		section		(m_testCtx.getLog(), (string("Iter") + de::toString(m_iterNdx)), sectionName);
	de::Random						rnd			(deStringHash(getName()) ^ deInt32Hash(m_iterNdx));
	tcu::Surface					result		(FRAMEBUFFER_WIDTH, FRAMEBUFFER_HEIGHT);

	m_fbo->bindForRendering();
	gl.clearColor(0.0f, 0.0f, 0.0f, 1.0f);
	gl.clear(GL_COLOR_BUFFER_BIT);

	drawRandomPrimitives(renderCtx, m_program->getProgram(), m_primitiveType, 1, &rnd);

	m_fbo->readPixels(0, 0, result.getAccess());

	if (!verifyHelperInvocationDerivate(m_testCtx.getLog(), result, m_numSamples != 0))
		m_testCtx.setTestResult(QP_TEST_RESULT_FAIL, "Invalid pixels found");

	m_iterNdx += 1;
	return (m_iterNdx < m_numIters) ? CONTINUE : STOP;
}